

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O0

void __thiscall flatbuffers::python::Version::Version(Version *this,string *version)

{
  _Ios_Openmode _Var1;
  istream *piVar2;
  char local_1a1;
  stringstream local_1a0 [7];
  char dot;
  stringstream ss;
  string *version_local;
  Version *this_local;
  
  this->major = 0;
  this->minor = 0;
  this->micro = 0;
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)version,_Var1);
  piVar2 = (istream *)std::istream::operator>>((istream *)local_1a0,&this->major);
  piVar2 = std::operator>>(piVar2,&local_1a1);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&this->minor);
  piVar2 = std::operator>>(piVar2,&local_1a1);
  std::istream::operator>>(piVar2,&this->micro);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

Version::Version(const std::string &version) {
  std::stringstream ss(version);
  char dot;
  ss >> major >> dot >> minor >> dot >> micro;
}